

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O2

AffineSpace3fa * loadTransform(AffineSpace3fa *__return_storage_ptr__,RTCFormat format,float *xfm)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar13;
  long lVar14;
  undefined8 *puVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lStack_60;
  allocator local_49;
  string local_48 [32];
  
  *(undefined8 *)&(__return_storage_ptr__->l).vx.field_0 = 0x3f800000;
  *(undefined8 *)((long)&(__return_storage_ptr__->l).vx.field_0 + 8) = 0;
  *(undefined8 *)&(__return_storage_ptr__->l).vy.field_0 = 0x3f80000000000000;
  *(undefined8 *)((long)&(__return_storage_ptr__->l).vy.field_0 + 8) = 0;
  *(undefined8 *)&(__return_storage_ptr__->l).vz.field_0 = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->l).vz.field_0 + 8) = 0x3f800000;
  *(undefined8 *)&(__return_storage_ptr__->p).field_0 = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->p).field_0 + 8) = 0;
  lVar14 = 0x2c;
  lVar16 = 0x28;
  lVar20 = 0x14;
  if (format == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
    lVar18 = 0x1c;
    lVar19 = 0xc;
    lVar21 = 0x18;
    lVar22 = 8;
    lVar17 = 0x24;
    lVar23 = 4;
    lVar24 = 0x20;
    lStack_60 = 0x10;
  }
  else {
    if (format == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      lVar14 = 0x38;
      lVar18 = 0x34;
      lVar19 = 0x30;
      lVar21 = 0x24;
      lVar22 = 0x20;
      lVar17 = 0x18;
      lStack_60 = 0x10;
    }
    else {
      if (format != RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        puVar15 = (undefined8 *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_48,"invalid matrix format",&local_49);
        *puVar15 = &PTR__rtcore_error_021d38e0;
        *(undefined4 *)(puVar15 + 1) = 3;
        std::__cxx11::string::string((string *)(puVar15 + 2),local_48);
        __cxa_throw(puVar15,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
      }
      lVar18 = 0x28;
      lVar19 = 0x24;
      lVar16 = 0x20;
      lVar21 = 0x1c;
      lVar22 = 0x18;
      lVar17 = 0x14;
      lVar20 = 0x10;
      lStack_60 = 0xc;
    }
    lVar23 = lStack_60;
    lVar24 = 8;
    lStack_60 = 4;
  }
  uVar1 = *(undefined4 *)((long)xfm + lVar20);
  uVar2 = *(undefined4 *)((long)xfm + lVar23);
  uVar3 = *(undefined4 *)((long)xfm + lVar17);
  uVar4 = *(undefined4 *)((long)xfm + lVar21);
  uVar5 = *(undefined4 *)((long)xfm + lVar22);
  uVar6 = *(undefined4 *)((long)xfm + lVar16);
  uVar7 = *(undefined4 *)((long)xfm + lVar18);
  uVar8 = *(undefined4 *)((long)xfm + lVar19);
  uVar9 = *(undefined4 *)((long)xfm + lVar14);
  aVar11.m128[1] = (float)*(undefined4 *)((long)xfm + lStack_60);
  aVar11.m128[0] = *xfm;
  aVar11.m128[2] = (float)*(undefined4 *)((long)xfm + lVar24);
  aVar11.m128[3] = 0.0;
  (__return_storage_ptr__->l).vx.field_0 = aVar11;
  aVar10.m128[1] = (float)uVar1;
  aVar10.m128[0] = (float)uVar2;
  aVar10.m128[2] = (float)uVar3;
  aVar10.m128[3] = 0.0;
  (__return_storage_ptr__->l).vy.field_0 = aVar10;
  aVar12.m128[1] = (float)uVar4;
  aVar12.m128[0] = (float)uVar5;
  aVar12.m128[2] = (float)uVar6;
  aVar12.m128[3] = 0.0;
  (__return_storage_ptr__->l).vz.field_0 = aVar12;
  aVar13.m128[1] = (float)uVar7;
  aVar13.m128[0] = (float)uVar8;
  aVar13.m128[2] = (float)uVar9;
  aVar13.m128[3] = 0.0;
  (__return_storage_ptr__->p).field_0 = aVar13;
  return __return_storage_ptr__;
}

Assistant:

RTC_API bool rtcIsSYCLDeviceSupported(const sycl::device device)
  {
    try {
      RTC_TRACE(rtcIsSYCLDeviceSupported);
      return rthwifIsSYCLDeviceSupported(device) > 0;
    } catch (...) {
      return false;
    }
    return false;
  }